

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<const_libaom_test::CodecFactory_*,_int,_int,_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this,
          ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_int>_>
          *base,tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
                *generators,bool is_end)

{
  ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_int>_> *in_RSI;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *in_RDI;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  *in_stack_ffffffffffffff58;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  *in_stack_ffffffffffffff60;
  ParamGenerator<const_libaom_test::CodecFactory_*> *in_stack_ffffffffffffff68;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  *in_stack_ffffffffffffff70;
  
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_int>_>::
  ParamIteratorInterface
            (&in_RDI->
              super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_int>_>
            );
  (in_RDI->
  super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_int>_>).
  _vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01f5d850;
  in_RDI->base_ = in_RSI;
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
              *)0x689451);
  ParamGenerator<const_libaom_test::CodecFactory_*>::begin(in_stack_ffffffffffffff68);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
              *)0x689470);
  ParamGenerator<int>::begin((ParamGenerator<int> *)in_stack_ffffffffffffff68);
  std::
  get<2ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
              *)0x68948c);
  ParamGenerator<int>::begin((ParamGenerator<int> *)in_stack_ffffffffffffff68);
  std::
  get<3ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
              *)0x6894a8);
  ParamGenerator<int>::begin((ParamGenerator<int> *)in_stack_ffffffffffffff68);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_true,_true>
            (in_stack_ffffffffffffff70,
             (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff68,
             (ParamIterator<int> *)in_stack_ffffffffffffff60,
             (ParamIterator<int> *)in_stack_ffffffffffffff58,(ParamIterator<int> *)0x6894d8);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x6894e4);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x6894ee);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x6894f8);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x689505);
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
              *)0x689520);
  ParamGenerator<const_libaom_test::CodecFactory_*>::end(in_stack_ffffffffffffff68);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
              *)0x68953c);
  ParamGenerator<int>::end((ParamGenerator<int> *)in_stack_ffffffffffffff68);
  std::
  get<2ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
              *)0x689558);
  ParamGenerator<int>::end((ParamGenerator<int> *)in_stack_ffffffffffffff68);
  std::
  get<3ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
              *)0x689574);
  ParamGenerator<int>::end((ParamGenerator<int> *)in_stack_ffffffffffffff68);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_true,_true>
            (in_stack_ffffffffffffff70,
             (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff68,
             (ParamIterator<int> *)in_stack_ffffffffffffff60,
             (ParamIterator<int> *)in_stack_ffffffffffffff58,(ParamIterator<int> *)0x6895a1);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x6895ad);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x6895b7);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x6895c1);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x6895cb);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  ::tuple(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_int>_>::shared_ptr
            ((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_int>_> *)0x689625);
  ComputeCurrentValue(in_RDI);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }